

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O1

bool __thiscall GrcFont::IsGraphiteFont(GrcFont *this,void *pHdr,void *pTableDir)

{
  bool bVar1;
  bool bVar2;
  size_t lnSize;
  size_t lnOffset;
  size_t sStack_28;
  size_t local_20;
  
  bVar1 = TtfUtil::GetTableInfo(ktiSilf,pHdr,pTableDir,&local_20,&sStack_28);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = TtfUtil::GetTableInfo(ktiGloc,pHdr,pTableDir,&local_20,&sStack_28);
    if (!bVar1) {
      bVar1 = TtfUtil::GetTableInfo(ktiGlat,pHdr,pTableDir,&local_20,&sStack_28);
      if (!bVar1) {
        bVar2 = TtfUtil::GetTableInfo(ktiFeat,pHdr,pTableDir,&local_20,&sStack_28);
      }
    }
  }
  return bVar2;
}

Assistant:

bool GrcFont::IsGraphiteFont(void * pHdr, void * pTableDir)
{
	size_t lnOffset, lnSize;

	if (TtfUtil::GetTableInfo(ktiSilf, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGloc, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGlat, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiFeat, pHdr, pTableDir, lnOffset, lnSize))
		return true;

	return false;
}